

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O2

int tcv_get_enhanced_options(tcv_t *tcv,tcv_enhanced_options_type_t *options)

{
  _Bool _Var1;
  int iVar2;
  
  _Var1 = tcv_check_and_lock_ok(tcv);
  if (options == (tcv_enhanced_options_type_t *)0x0 || !_Var1) {
    iVar2 = -4;
  }
  else {
    iVar2 = -0xd;
    if (((tcv != (tcv_t *)0x0) && (tcv->created == true)) && (tcv->initialized == true)) {
      iVar2 = (*tcv->fun->get_enhanced_options)(tcv,options);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  return iVar2;
}

Assistant:

int tcv_get_enhanced_options(tcv_t *tcv, tcv_enhanced_options_type_t *options)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !options)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_enhanced_options(tcv, options);
	}

	tcv_unlock(tcv);
	return ret;
}